

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void Action_add(action **app,e_action type,symbol *sp,char *arg)

{
  action **ppaVar1;
  undefined1 auVar2 [16];
  action *paVar3;
  long lVar4;
  void *__ptr;
  undefined1 auVar5 [16];
  long lVar6;
  
  if (Action_new_actionfreelist == (action *)0x0) {
    __ptr = (void *)0x64;
    paVar3 = (action *)calloc(100,0x30);
    auVar2 = _DAT_0010d020;
    Action_new_actionfreelist = paVar3;
    if (paVar3 == (action *)0x0) {
      Action_add_cold_1();
      free(*(void **)((long)__ptr + 8));
      free(*(void **)((long)__ptr + 0x10));
      free(__ptr);
      return;
    }
    lVar4 = 0x50;
    auVar5 = _DAT_0010d010;
    do {
      lVar6 = auVar5._8_8_;
      if (SUB164(auVar5 ^ auVar2,4) == -0x80000000 && SUB164(auVar5 ^ auVar2,0) < -0x7fffff9d) {
        *(action **)((long)&paVar3[-1].sp + lVar4) = paVar3 + auVar5._0_8_ + 1;
        *(action **)((long)&paVar3->sp + lVar4) = paVar3 + lVar6 + 1;
      }
      auVar5._0_8_ = auVar5._0_8_ + 2;
      auVar5._8_8_ = lVar6 + 2;
      lVar4 = lVar4 + 0x60;
    } while (lVar4 != 0x1310);
    paVar3[99].next = (action *)0x0;
  }
  paVar3 = Action_new_actionfreelist;
  ppaVar1 = &Action_new_actionfreelist->next;
  Action_new_actionfreelist = Action_new_actionfreelist->next;
  *ppaVar1 = *app;
  *app = paVar3;
  paVar3->type = type;
  paVar3->sp = sp;
  paVar3->spOpt = (symbol *)0x0;
  (paVar3->x).stp = (state *)arg;
  return;
}

Assistant:

void Action_add(
  struct action **app,
  enum e_action type,
  struct symbol *sp,
  char *arg
){
  struct action *newaction;
  newaction = Action_new();
  newaction->next = *app;
  *app = newaction;
  newaction->type = type;
  newaction->sp = sp;
  newaction->spOpt = 0;
  if( type==SHIFT ){
    newaction->x.stp = (struct state *)arg;
  }else{
    newaction->x.rp = (struct rule *)arg;
  }
}